

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_REG_REG(CodeGenGenericContext *ctx,x86Command op,x86XmmReg reg1,x86XmmReg reg2)

{
  x86Argument arg;
  x86XmmReg reg;
  CodeGenGenericContext *this;
  x86Argument local_40;
  x86XmmReg local_1c;
  x86XmmReg local_18;
  x86XmmReg reg2_local;
  x86XmmReg reg1_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  local_1c = reg2;
  local_18 = reg1;
  reg2_local = op;
  _reg1_local = ctx;
  if (op == o_movsd) {
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    if (local_18 == local_1c) {
      _reg1_local->optimizationCount = _reg1_local->optimizationCount + 1;
      return;
    }
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    this = _reg1_local;
    reg = local_18;
    x86Argument::x86Argument(&local_40,local_1c);
    arg.field_1.imm64Arg = local_40.field_1.imm64Arg;
    arg.type = local_40.type;
    arg._4_4_ = local_40._4_4_;
    arg.ptrBase = local_40.ptrBase;
    arg.ptrIndex = local_40.ptrIndex;
    arg.ptrMult = local_40.ptrMult;
    arg.ptrNum = local_40.ptrNum;
    CodeGenGenericContext::OverwriteRegisterWithValue(this,reg,arg);
  }
  else if (op - o_cvtss2sd < 2) {
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(_reg1_local,local_18);
  }
  else {
    if (8 < op - o_addsd) {
      __assert_fail("!\"unknown instruction\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                    ,0x583,
                    "void EMIT_OP_REG_REG(CodeGenGenericContext &, x86Command, x86XmmReg, x86XmmReg)"
                   );
    }
    local_1c = CodeGenGenericContext::RedirectRegister(ctx,reg2);
    CodeGenGenericContext::ReadRegister(_reg1_local,local_1c);
    CodeGenGenericContext::ReadAndModifyRegister(_reg1_local,local_18);
  }
  _reg1_local->x86Op->name = reg2_local;
  (_reg1_local->x86Op->argA).type = argXmmReg;
  (_reg1_local->x86Op->argA).field_1.xmmArg = local_18;
  (_reg1_local->x86Op->argB).type = argXmmReg;
  (_reg1_local->x86Op->argB).field_1.xmmArg = local_1c;
  _reg1_local->x86Op = _reg1_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_REG_REG(CodeGenGenericContext &ctx, x86Command op, x86XmmReg reg1, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_movsd:
		reg2 = ctx.RedirectRegister(reg2);

		// Skip self-assignment
		if(reg1 == reg2)
		{
			ctx.optimizationCount++;
			return;
		}

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithValue(reg1, x86Argument(reg2));
		break;
	case o_cvtss2sd:
	case o_cvtsd2ss:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);

		ctx.OverwriteRegisterWithUnknown(reg1);
		break;
	case o_addsd:
	case o_subsd:
	case o_mulsd:
	case o_divsd:
	case o_sqrtsd:
	case o_cmpeqsd:
	case o_cmpltsd:
	case o_cmplesd:
	case o_cmpneqsd:
		reg2 = ctx.RedirectRegister(reg2);

		ctx.ReadRegister(reg2);
		ctx.ReadAndModifyRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argXmmReg;
	ctx.x86Op->argA.xmmArg = reg1;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}